

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SettingsHandlerWindow_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  ImGuiWindow *pIVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindowSettings *pIVar4;
  int iVar5;
  int i;
  ImVector<ImGuiWindowSettings> *this;
  
  this = &ctx->SettingsWindows;
  iVar5 = 0;
  do {
    if (iVar5 == (ctx->Windows).Size) {
      iVar5 = (buf->Buf).Size;
      iVar2 = iVar5 + -1;
      if (iVar5 == 0) {
        iVar2 = 0;
      }
      ImVector<char>::reserve(&buf->Buf,this->Size * 0x60 + iVar2);
      for (iVar5 = 0; iVar5 != this->Size; iVar5 = iVar5 + 1) {
        pIVar4 = ImVector<ImGuiWindowSettings>::operator[](this,iVar5);
        ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pIVar4->Name);
        ImGuiTextBuffer::appendf
                  (buf,"Pos=%d,%d\n",(ulong)(uint)(int)(pIVar4->Pos).x,
                   (ulong)(uint)(int)(pIVar4->Pos).y);
        ImGuiTextBuffer::appendf
                  (buf,"Size=%d,%d\n",(ulong)(uint)(int)(pIVar4->Size).x,
                   (ulong)(uint)(int)(pIVar4->Size).y);
        ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)pIVar4->Collapsed);
        ImGuiTextBuffer::appendf(buf,"\n");
      }
      return;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,iVar5);
    pIVar1 = *ppIVar3;
    if ((pIVar1->Flags & 0x100) == 0) {
      if (pIVar1->SettingsIdx == -1) {
        pIVar4 = ImGui::FindWindowSettings(pIVar1->ID);
        if (pIVar4 == (ImGuiWindowSettings *)0x0) {
          pIVar4 = ImGui::CreateNewWindowSettings(pIVar1->Name);
          iVar2 = ImVector<ImGuiWindowSettings>::index_from_ptr(this,pIVar4);
          pIVar1->SettingsIdx = iVar2;
        }
      }
      else {
        pIVar4 = ImVector<ImGuiWindowSettings>::operator[](this,pIVar1->SettingsIdx);
      }
      if (pIVar4->ID != pIVar1->ID) {
        __assert_fail("settings->ID == window->ID",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                      ,0x249e,
                      "void SettingsHandlerWindow_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                     );
      }
      pIVar4->Pos = (ImVec2ih)((int)(pIVar1->Pos).x & 0xffffU | (int)(pIVar1->Pos).y << 0x10);
      pIVar4->Size = (ImVec2ih)
                     ((int)(pIVar1->SizeFull).x & 0xffffU | (int)(pIVar1->SizeFull).y << 0x10);
      pIVar4->Collapsed = pIVar1->Collapsed;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

static void SettingsHandlerWindow_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsIdx != -1) ? &g.SettingsWindows[window->SettingsIdx] : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsIdx = g.SettingsWindows.index_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih((short)window->Pos.x, (short)window->Pos.y);
        settings->Size = ImVec2ih((short)window->SizeFull.x, (short)window->SizeFull.y);
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.Size * 96); // ballpark reserve
    for (int i = 0; i != g.SettingsWindows.Size; i++)
    {
        const ImGuiWindowSettings* settings = &g.SettingsWindows[i];
        buf->appendf("[%s][%s]\n", handler->TypeName, settings->Name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->appendf("\n");
    }
}